

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.h
# Opt level: O1

void __thiscall
CNetAddr::Serialize<ParamsStream<VectorWriter&,CAddress::SerParams>>
          (CNetAddr *this,ParamsStream<VectorWriter_&,_CAddress::SerParams> *s)

{
  size_t in_RCX;
  long in_FS_OFFSET;
  uint8_t serialized [16];
  uint8_t auStack_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((s->m_params->super_SerParams).enc == V2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      SerializeV2Stream<ParamsStream<VectorWriter&,CAddress::SerParams>>(this,s);
      return;
    }
  }
  else {
    SerializeV1Array(this,&auStack_28);
    VectorWriter::write(s->m_substream,(int)auStack_28,(void *)0x10,in_RCX);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& s) const
    {
        if (s.template GetParams<SerParams>().enc == Encoding::V2) {
            SerializeV2Stream(s);
        } else {
            SerializeV1Stream(s);
        }
    }